

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_hash_join.cpp
# Opt level: O2

void __thiscall
duckdb::HashJoinGlobalSourceState::PrepareBuild
          (HashJoinGlobalSourceState *this,HashJoinGlobalSinkState *sink)

{
  unique_ptr<duckdb::TemporaryMemoryState,_std::default_delete<duckdb::TemporaryMemoryState>,_true>
  *this_00;
  ClientContext *context;
  bool bVar1;
  uint uVar2;
  type this_01;
  pointer pTVar3;
  idx_t iVar4;
  type this_02;
  idx_t *piVar5;
  ulong uVar6;
  ulong uVar7;
  
  this_00 = &sink->temporary_memory_state;
  while( true ) {
    this_01 = unique_ptr<duckdb::JoinHashTable,_std::default_delete<duckdb::JoinHashTable>,_true>::
              operator*(&sink->hash_table);
    pTVar3 = unique_ptr<duckdb::TemporaryMemoryState,_std::default_delete<duckdb::TemporaryMemoryState>,_true>
             ::operator->(this_00);
    context = sink->context;
    iVar4 = JoinHashTable::GetRemainingSize(this_01);
    TemporaryMemoryState::SetRemainingSizeAndUpdateReservation
              (pTVar3,context,iVar4 + sink->probe_side_requirement);
    if (sink->external != true) break;
    pTVar3 = unique_ptr<duckdb::TemporaryMemoryState,_std::default_delete<duckdb::TemporaryMemoryState>,_true>
             ::operator->(this_00);
    iVar4 = TemporaryMemoryState::GetReservation(pTVar3);
    bVar1 = JoinHashTable::PrepareExternalFinalize(this_01,iVar4 - sink->probe_side_requirement);
    if (!bVar1) break;
    this_02 = unique_ptr<duckdb::TupleDataCollection,_std::default_delete<duckdb::TupleDataCollection>,_true>
              ::operator*(&this_01->data_collection);
    piVar5 = TupleDataCollection::Count(this_02);
    if (((*piVar5 != 0) ||
        (uVar2 = (uint)(byte)(this->op->super_PhysicalComparisonJoin).super_PhysicalJoin.
                             super_CachingPhysicalOperator.field_0x81, 10 < uVar2)) ||
       ((0x62cU >> (uVar2 & 0x1f) & 1) == 0)) {
      this->build_chunk_idx = 0;
      iVar4 = TupleDataCollection::ChunkCount(this_02);
      this->build_chunk_count = iVar4;
      this->build_chunk_done = 0;
      if ((sink->context->config).verify_parallelism == false) {
        bVar1 = KeysAreSkewed(sink);
        uVar7 = this->build_chunk_count;
        if (!bVar1) {
          uVar6 = 0x40;
          if (uVar7 < 0x40) {
            uVar6 = uVar7;
          }
          uVar7 = uVar6 + (uVar6 == 0);
        }
      }
      else {
        uVar7 = 1;
      }
      this->build_chunks_per_thread = uVar7;
      JoinHashTable::AllocatePointerTable(this_01);
      JoinHashTable::InitializePointerTable(this_01,0,this_01->capacity);
      LOCK();
      (this->global_stage)._M_i = BUILD;
      UNLOCK();
      return;
    }
  }
  LOCK();
  (this->global_stage)._M_i = DONE;
  UNLOCK();
  pTVar3 = unique_ptr<duckdb::TemporaryMemoryState,_std::default_delete<duckdb::TemporaryMemoryState>,_true>
           ::operator->(this_00);
  TemporaryMemoryState::SetZero(pTVar3);
  return;
}

Assistant:

void HashJoinGlobalSourceState::PrepareBuild(HashJoinGlobalSinkState &sink) {
	D_ASSERT(global_stage != HashJoinSourceStage::BUILD);
	auto &ht = *sink.hash_table;

	// Update remaining size
	sink.temporary_memory_state->SetRemainingSizeAndUpdateReservation(sink.context, ht.GetRemainingSize() +
	                                                                                    sink.probe_side_requirement);

	// Try to put the next partitions in the block collection of the HT
	D_ASSERT(!sink.external || sink.temporary_memory_state->GetReservation() >= sink.probe_side_requirement);
	if (!sink.external ||
	    !ht.PrepareExternalFinalize(sink.temporary_memory_state->GetReservation() - sink.probe_side_requirement)) {
		global_stage = HashJoinSourceStage::DONE;
		sink.temporary_memory_state->SetZero();
		return;
	}

	auto &data_collection = ht.GetDataCollection();
	if (data_collection.Count() == 0 && op.EmptyResultIfRHSIsEmpty()) {
		PrepareBuild(sink);
		return;
	}

	build_chunk_idx = 0;
	build_chunk_count = data_collection.ChunkCount();
	build_chunk_done = 0;

	if (sink.context.config.verify_parallelism) {
		build_chunks_per_thread = 1;
	} else {
		if (KeysAreSkewed(sink)) {
			build_chunks_per_thread = build_chunk_count; // This forces single-threaded building
		} else {
			build_chunks_per_thread = // Same task size as in HashJoinFinalizeEvent
			    MaxValue<idx_t>(MinValue(build_chunk_count, HashJoinFinalizeEvent::CHUNKS_PER_TASK), 1);
		}
	}

	ht.AllocatePointerTable();
	ht.InitializePointerTable(0, ht.capacity);

	global_stage = HashJoinSourceStage::BUILD;
}